

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int sx_hashtbltval_find(sx_hashtbl_tval *tbl,uint32_t key)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  bVar1 = (byte)tbl->_bitshift;
  uVar4 = (ulong)(key >> (bVar1 & 0x3f) ^ key) * -0x61c8864680b583eb >> (bVar1 & 0x3f);
  uVar3 = (uint)uVar4;
  if (tbl->keys[uVar4 & 0xffffffff] != key) {
    uVar2 = tbl->capacity;
    tbl->_miss_cnt = tbl->_miss_cnt + 1;
    if (1 < uVar2) {
      iVar5 = tbl->_probe_cnt;
      iVar6 = uVar2 - 1;
      do {
        uVar3 = uVar3 + 1;
        iVar5 = iVar5 + 1;
        tbl->_probe_cnt = iVar5;
        if (tbl->keys[(int)(uVar3 % uVar2)] == key) {
          return uVar3 % uVar2;
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

int sx_hashtbltval_find(const sx_hashtbl_tval* tbl, uint32_t key)
{
    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    if (tbl->keys[h] == key) {
        return h;
    } else {
#if SX_CONFIG_HASHTBL_DEBUG
        sx_hashtbl_tval* _tbl = (sx_hashtbl_tval*)tbl;
        ++_tbl->_miss_cnt;
#endif
        // probe lineary in the keys array
        for (uint32_t i = 1; i < cnt; i++) {
            int idx = (h + i) % cnt;
#if SX_CONFIG_HASHTBL_DEBUG
            ++_tbl->_probe_cnt;
#endif
            if (tbl->keys[idx] == key)
                return idx;
        }

        return -1;    // Worst case: Not found!
    }
}